

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O0

bool __thiscall embree::TokenStream::trySymbol(TokenStream *this,string *symbol)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  int *piVar4;
  Stream<int> *in_RSI;
  size_t pos;
  ulong uVar5;
  ulong n;
  
  uVar5 = 0;
  while( true ) {
    n = uVar5;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar5) {
      return true;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    cVar1 = *pcVar3;
    piVar4 = Stream<int>::peek((Stream<int> *)symbol);
    if ((int)cVar1 != *piVar4) break;
    Stream<int>::drop((Stream<int> *)symbol);
    uVar5 = n + 1;
  }
  Stream<int>::unget(in_RSI,n);
  return false;
}

Assistant:

bool TokenStream::trySymbol(const std::string& symbol)
  {
    size_t pos = 0;
    while (pos < symbol.size()) {
      if (symbol[pos] != cin->peek()) { cin->unget(pos); return false; }
      cin->drop(); pos++;
    }
    return true;
  }